

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O0

void lzma_sha256_finish(lzma_check_state *check)

{
  __uint32_t _Var1;
  __uint64_t _Var2;
  ulong local_20;
  size_t pos;
  size_t i;
  lzma_check_state *check_local;
  
  local_20 = (check->state).sha256.size & 0x3f;
  (check->buffer).u8[local_20] = 0x80;
  while (local_20 = local_20 + 1, local_20 != 0x38) {
    if (local_20 == 0x40) {
      process(check);
      local_20 = 0;
    }
    (check->buffer).u8[local_20] = '\0';
  }
  (check->state).sha256.size = (check->state).sha256.size << 3;
  _Var2 = __bswap_64((check->state).sha256.size);
  (check->buffer).u64[7] = _Var2;
  process(check);
  for (pos = 0; pos < 8; pos = pos + 1) {
    _Var1 = __bswap_32(*(__uint32_t *)((long)&check->state + pos * 4));
    (check->buffer).u32[pos] = _Var1;
  }
  return;
}

Assistant:

extern void
lzma_sha256_finish(lzma_check_state *check)
{
	size_t i;

	// Add padding as described in RFC 3174 (it describes SHA-1 but
	// the same padding style is used for SHA-256 too).
	size_t pos = check->state.sha256.size & 0x3F;
	check->buffer.u8[pos++] = 0x80;

	while (pos != 64 - 8) {
		if (pos == 64) {
			process(check);
			pos = 0;
		}

		check->buffer.u8[pos++] = 0x00;
	}

	// Convert the message size from bytes to bits.
	check->state.sha256.size *= 8;

	check->buffer.u64[(64 - 8) / 8] = conv64be(check->state.sha256.size);

	process(check);

	for (i = 0; i < 8; ++i)
		check->buffer.u32[i] = conv32be(check->state.sha256.state[i]);

	return;
}